

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_differencer.cc
# Opt level: O1

bool __thiscall
google::protobuf::util::MessageDifferencer::Compare
          (MessageDifferencer *this,Message *message1,Message *message2,int unpacked_any,
          vector<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
          *parent_fields)

{
  pointer message2_00;
  bool bVar1;
  bool bVar2;
  int iVar3;
  UnknownFieldSet *unknown_field_set1;
  UnknownFieldSet *unknown_field_set2;
  undefined4 in_register_0000000c;
  byte unaff_BL;
  UnpackAnyField *this_00;
  bool bVar4;
  Metadata MVar5;
  Metadata MVar6;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  message2_fields;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  message1_fields;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  local_78;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  local_60;
  undefined8 local_48;
  Message *local_40;
  Descriptor *local_38;
  
  local_48 = CONCAT44(in_register_0000000c,unpacked_any);
  MVar5 = Message::GetMetadata(message1);
  iVar3 = std::__cxx11::string::compare((char *)((MVar5.descriptor)->all_names_ + 1));
  if (iVar3 == 0) {
    local_60.
    super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_78.
    super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    this_00 = &this->unpack_any_field_;
    bVar1 = UnpackAnyField::UnpackAny
                      (this_00,message1,
                       (unique_ptr<google::protobuf::Message,_std::default_delete<google::protobuf::Message>_>
                        *)&local_60);
    bVar2 = true;
    if (bVar1) {
      bVar1 = UnpackAnyField::UnpackAny
                        (this_00,message2,
                         (unique_ptr<google::protobuf::Message,_std::default_delete<google::protobuf::Message>_>
                          *)&local_78);
      if (bVar1) {
        local_40 = (Message *)
                   local_60.
                   super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        MVar5 = Message::GetMetadata
                          ((Message *)
                           local_60.
                           super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                           ._M_impl.super__Vector_impl_data._M_start);
        message2_00 = local_78.
                      super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                      ._M_impl.super__Vector_impl_data._M_start;
        local_38 = MVar5.descriptor;
        MVar5 = Message::GetMetadata
                          ((Message *)
                           local_78.
                           super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                           ._M_impl.super__Vector_impl_data._M_start);
        if (local_38 == MVar5.descriptor) {
          bVar2 = Compare(this,local_40,(Message *)message2_00,(int)local_48 + 1,parent_fields);
          this_00 = (UnpackAnyField *)(ulong)bVar2;
          bVar2 = false;
        }
      }
    }
    unaff_BL = (byte)this_00;
    if ((Message *)
        local_78.
        super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
        ._M_impl.super__Vector_impl_data._M_start != (Message *)0x0) {
      (*((MessageLite *)
        local_78.
        super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
        ._M_impl.super__Vector_impl_data._M_start)->_vptr_MessageLite[1])();
    }
    if ((Message *)
        local_60.
        super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
        ._M_impl.super__Vector_impl_data._M_start != (Message *)0x0) {
      (*((MessageLite *)
        local_60.
        super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
        ._M_impl.super__Vector_impl_data._M_start)->_vptr_MessageLite[1])();
    }
    if (!bVar2) goto LAB_0031c4a3;
  }
  bVar2 = true;
  if (this->message_field_comparison_ != EQUIVALENT) {
    MVar5 = Message::GetMetadata(message1);
    MVar6 = Message::GetMetadata(message2);
    unknown_field_set1 = Reflection::GetUnknownFields(MVar5.reflection,message1);
    unknown_field_set2 = Reflection::GetUnknownFields(MVar6.reflection,message2);
    bVar2 = CompareUnknownFields
                      (this,message1,message2,unknown_field_set1,unknown_field_set2,parent_fields);
    bVar4 = this->reporter_ != (Reporter *)0x0;
    bVar1 = !bVar4 && !bVar2;
    if (bVar1) {
      unaff_BL = unaff_BL & (bVar4 || bVar2);
      goto LAB_0031c4a3;
    }
    bVar2 = bVar2 || bVar1;
  }
  RetrieveFields(&local_60,this,message1,true);
  RetrieveFields(&local_78,this,message2,false);
  bVar1 = CompareRequestedFieldsUsingSettings
                    (this,message1,message2,(int)local_48,&local_60,&local_78,parent_fields);
  if ((Message *)
      local_78.
      super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
      ._M_impl.super__Vector_impl_data._M_start != (Message *)0x0) {
    operator_delete(local_78.
                    super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_78.
                          super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_78.
                          super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if ((Message *)
      local_60.
      super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
      ._M_impl.super__Vector_impl_data._M_start != (Message *)0x0) {
    operator_delete(local_60.
                    super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_60.
                          super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_60.
                          super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  unaff_BL = bVar2 & bVar1;
LAB_0031c4a3:
  return (bool)(unaff_BL & 1);
}

Assistant:

bool MessageDifferencer::Compare(const Message& message1,
                                 const Message& message2, int unpacked_any,
                                 std::vector<SpecificField>* parent_fields) {
  // Expand google.protobuf.Any payload if possible.
  if (message1.GetDescriptor()->full_name() == internal::kAnyFullTypeName) {
    std::unique_ptr<Message> data1;
    std::unique_ptr<Message> data2;
    if (unpack_any_field_.UnpackAny(message1, &data1) &&
        unpack_any_field_.UnpackAny(message2, &data2) &&
        data1->GetDescriptor() == data2->GetDescriptor()) {
      return Compare(*data1, *data2, unpacked_any + 1, parent_fields);
    }
    // If the Any payload is unparsable, or the payload types are different
    // between message1 and message2, fall through and treat Any as a regular
    // proto.
  }

  bool unknown_compare_result = true;
  // Ignore unknown fields in EQUIVALENT mode
  if (message_field_comparison_ != EQUIVALENT) {
    const Reflection* reflection1 = message1.GetReflection();
    const Reflection* reflection2 = message2.GetReflection();
    const UnknownFieldSet& unknown_field_set1 =
        reflection1->GetUnknownFields(message1);
    const UnknownFieldSet& unknown_field_set2 =
        reflection2->GetUnknownFields(message2);
    if (!CompareUnknownFields(message1, message2, unknown_field_set1,
                              unknown_field_set2, parent_fields)) {
      if (reporter_ == NULL) {
        return false;
      }
      unknown_compare_result = false;
    }
  }

  std::vector<const FieldDescriptor*> message1_fields =
      RetrieveFields(message1, true);
  std::vector<const FieldDescriptor*> message2_fields =
      RetrieveFields(message2, false);

  return CompareRequestedFieldsUsingSettings(message1, message2, unpacked_any,
                                             message1_fields, message2_fields,
                                             parent_fields) &&
         unknown_compare_result;
}